

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# C++20Support.hpp
# Opt level: O3

string * std::format<char_const*>(string *__return_storage_ptr__,string_view fmt,char **ts)

{
  char *pcVar1;
  char *pcVar2;
  ostream *poVar3;
  size_t sVar4;
  char *pcVar5;
  size_t sVar6;
  ulong uVar7;
  size_t sVar8;
  long lVar9;
  array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL> fragments;
  stringstream ss;
  size_t asStack_3c0 [2];
  char *local_3b0;
  long alStack_3a8 [62];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  pcVar5 = fmt._M_str;
  sVar8 = fmt._M_len;
  uVar7 = 0;
  asStack_3c0[0] = 0x11af72;
  memset(asStack_3c0 + 1,0,0x200);
  pcVar2 = pcVar5;
  if (sVar8 != 0) {
    sVar6 = 0;
    uVar7 = 0;
    pcVar1 = pcVar5;
    do {
      pcVar2 = pcVar5 + sVar6;
      if ((pcVar5[sVar6] != '}') && (pcVar2 = pcVar1, pcVar5[sVar6] == '{')) {
        if (pcVar1 == pcVar5) {
          asStack_3c0[uVar7 * 2 + 1] = sVar6;
          (&local_3b0)[uVar7 * 2] = pcVar5;
          pcVar2 = pcVar5;
          uVar7 = uVar7 + 1;
        }
        else if (uVar7 < 0x20 && pcVar5 + sVar6 != pcVar1) {
          asStack_3c0[uVar7 * 2 + 1] = (size_t)(pcVar5 + ((sVar6 - 1) - (long)pcVar1));
          (&local_3b0)[uVar7 * 2] = pcVar1 + 1;
          uVar7 = uVar7 + 1;
        }
      }
      sVar6 = sVar6 + 1;
      pcVar1 = pcVar2;
    } while (sVar8 != sVar6);
  }
  pcVar2 = pcVar2 + 1;
  if (pcVar2 != pcVar5 + sVar8) {
    asStack_3c0[uVar7 * 2 + 1] = (long)(pcVar5 + sVar8) - (long)pcVar2;
    (&local_3b0)[uVar7 * 2] = pcVar2;
  }
  asStack_3c0[0] = 0x11b025;
  std::__cxx11::stringstream::stringstream(local_1b8);
  asStack_3c0[0] = 0x11b03e;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_3b0,asStack_3c0[1]);
  pcVar2 = *ts;
  if (pcVar2 == (char *)0x0) {
    asStack_3c0[0] = 0x11b07c;
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    asStack_3c0[0] = 0x11b051;
    sVar4 = strlen(pcVar2);
    asStack_3c0[0] = 0x11b05f;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar2,sVar4);
  }
  for (lVar9 = 0x18; lVar9 != 0x208; lVar9 = lVar9 + 0x10) {
    asStack_3c0[0] = 0x11b0a0;
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,*(char **)((long)asStack_3c0 + lVar9 + 8U),
               *(long *)((long)asStack_3c0 + lVar9));
  }
  asStack_3c0[0] = 0x11b0b2;
  std::__cxx11::stringbuf::str();
  asStack_3c0[0] = 0x11b0c6;
  std::__cxx11::stringstream::~stringstream(local_1b8);
  asStack_3c0[0] = 0x11b0d3;
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string format(std::string_view fmt, auto&&... ts) {
    if (sizeof...(ts) == 0) return std::string(fmt);
    std::array<std::string_view, 32> fragments{};
    if (sizeof...(ts) > fragments.size()) throw std::length_error("format parameters count limit exceeded");
    size_t index = 0;
    auto start = fmt.cbegin(), parser = start;
    while (parser != fmt.cend()) {
        if (*parser == '{') {
            if (start == fmt.cbegin())
                fragments[index++] = std::string_view(start, static_cast<size_t>(parser - start));          /// string_view constructor with iterators is missing in Apple Clang 13
            else if (start != parser && index < fragments.size())
                fragments[index++] = std::string_view(start + 1, static_cast<size_t>(parser - (start + 1)));/// string_view constructor with iterators is missing in Apple Clang 13
        }
        else if (*parser == '}')
            start = parser;
        ++parser;
    }
    if (start + 1 != fmt.cend()) fragments[index++] = std::string_view(start + 1, static_cast<size_t>(fmt.cend() - (start + 1)));/// string_view constructor with iterators is missing in Apple Clang 13

    auto frag = fragments.cbegin();
    stringstream ss;
    using webfront::operator<<;
    ((ss << *frag++ << std::forward<decltype(ts)>(ts)), ...);
    while (frag != fragments.cend()) ss << *frag++;
    return ss.str();
}